

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BondOrderParameter.cpp
# Opt level: O2

void __thiscall OpenMD::BondOrderParameter::initializeHistogram(BondOrderParameter *this)

{
  mapped_type *pmVar1;
  long lVar2;
  key_type kVar3;
  bool bVar4;
  key_type local_48;
  BondOrderParameter *local_40;
  key_type local_38;
  
  kVar3.first = 0;
  kVar3.second = 0;
  local_40 = this;
  while ((long)kVar3 < (long)local_40->nBins_) {
    lVar2 = 0xd;
    local_38 = kVar3;
    while (bVar4 = lVar2 != 0, lVar2 = lVar2 + -1, bVar4) {
      local_48 = kVar3;
      pmVar1 = std::
               map<std::pair<int,_int>,_int,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
               ::operator[](&this->Q_histogram_,&local_48);
      *pmVar1 = 0;
      local_48 = kVar3;
      pmVar1 = std::
               map<std::pair<int,_int>,_int,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
               ::operator[](&this->W_histogram_,&local_48);
      *pmVar1 = 0;
      kVar3 = (key_type)((long)kVar3 + 0x100000000);
    }
    kVar3 = (key_type)((long)local_38 + 1);
  }
  return;
}

Assistant:

void BondOrderParameter::initializeHistogram() {
    for (int bin = 0; bin < nBins_; bin++) {
      for (int l = 0; l <= lMax_; l++) {
        Q_histogram_[std::make_pair(bin, l)] = 0;
        W_histogram_[std::make_pair(bin, l)] = 0;
      }
    }
  }